

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O0

void __thiscall
TEST_MockStrictOrderTest_orderViolatedWithinAScope_TestShell::
~TEST_MockStrictOrderTest_orderViolatedWithinAScope_TestShell
          (TEST_MockStrictOrderTest_orderViolatedWithinAScope_TestShell *this)

{
  TEST_MockStrictOrderTest_orderViolatedWithinAScope_TestShell *this_local;
  
  ~TEST_MockStrictOrderTest_orderViolatedWithinAScope_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockStrictOrderTest, orderViolatedWithinAScope)
{
    MockFailureReporterInstaller failureReporterInstaller;
    mock().strictOrder();

    MockExpectedCallsListForTest expectations;
    expectations.addFunctionOrdered("scope::foo1", 1)->callWasMade(2);
    expectations.addFunctionOrdered("scope::foo2", 2)->callWasMade(1);
    MockCallOrderFailure expectedFailure(mockFailureTest(), expectations);

    mock("scope").expectOneCall("foo1");
    mock("scope").expectOneCall("foo2");
    mock("scope").actualCall("foo2");
    mock("scope").actualCall("foo1");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}